

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.h
# Opt level: O3

bool __thiscall tupleCompare::operator()(tupleCompare *this,Tuple *A,Tuple *B)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  bVar7 = false;
  uVar3 = (uint)((ulong)((long)(A->data).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(A->data).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if ((0 < (int)uVar3) &&
     (uVar2 = (ulong)((long)(B->data).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(B->data).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5, 0 < (int)uVar2)) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    bVar7 = true;
    lVar5 = 0;
    uVar6 = 1;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((string *)
                         ((long)&(((A->data).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar5));
      if (iVar1 < 0) {
        iVar1 = 1;
        goto LAB_0010ffc2;
      }
      iVar1 = std::__cxx11::string::compare
                        ((string *)
                         ((long)&(((A->data).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar5));
      if (0 < iVar1) break;
      bVar7 = uVar6 < uVar4;
      if (uVar6 == uVar4) goto LAB_0010ffc2;
      lVar5 = lVar5 + 0x20;
      bVar8 = uVar6 != (uVar2 & 0xffffffff);
      uVar6 = uVar6 + 1;
    } while (bVar8);
    iVar1 = 0;
LAB_0010ffc2:
    bVar7 = (bool)(bVar7 & (byte)iVar1);
  }
  return bVar7;
}

Assistant:

bool operator()(const Tuple& A, const Tuple& B)
 {
//   cout << "Called compare" << endl;
   int lA = A.data.size();
   int lB = B.data.size();
   for (int i = 0; i < lA; i++)
   {
    // cout << lB << "comparing " << A[i] << " to " << B[i] << endl;
     if (i >= lB) return false;
     if (A.data[i] < B.data[i]) return true;
     else if (A.data[i] > B.data[i]) return false;
   }
   return false;
 }